

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix4 * matrix4_inverse(matrix4 *self,matrix4 *mR)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  undefined1 auVar57 [16];
  long lVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  double dVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dStack_350;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  double local_338;
  undefined8 uStack_330;
  double dStack_320;
  double dStack_310;
  double dStack_300;
  double dStack_2e0;
  double dStack_2d0;
  undefined8 uStack_2b0;
  double dStack_2a0;
  double dStack_290;
  double dStack_280;
  double dStack_270;
  double dStack_240;
  double dStack_220;
  double dStack_1f0;
  double dStack_1e0;
  double dStack_1d0;
  double dStack_1c0;
  double dStack_1b0;
  double dStack_1a0;
  double dStack_180;
  double dStack_150;
  double dStack_140;
  double dStack_130;
  double dStack_120;
  double dStack_110;
  double dStack_100;
  double dStack_f0;
  double dStack_e0;
  double dStack_d0;
  double dStack_c0;
  double dStack_b0;
  double dStack_a0;
  double local_98 [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  dVar11 = matrix4_determinant(self);
  uVar59 = (undefined4)((ulong)-dVar11 >> 0x20);
  if (-dVar11 <= dVar11) {
    uVar59 = (undefined4)((ulong)dVar11 >> 0x20);
  }
  if ((double)CONCAT44(uVar59,SUB84(dVar11,0)) <= 1e-05 &&
      (double)CONCAT44(uVar59,SUB84(dVar11,0)) != 1e-05) {
    mR = (matrix4 *)0x0;
  }
  else {
    dVar1 = (self->field_0).m[2];
    auVar4 = *(undefined1 (*) [16])((long)&self->field_0 + 0x48);
    dVar75 = auVar4._0_8_;
    dVar76 = auVar4._8_8_;
    dVar53 = (self->field_0).m[0xd];
    dVar54 = (self->field_0).m[0xe];
    dVar55 = (self->field_0).m[5];
    dVar56 = (self->field_0).m[6];
    auVar5 = *(undefined1 (*) [16])((long)&self->field_0 + 0x18);
    dVar68 = auVar5._0_8_;
    auVar6 = *(undefined1 (*) [16])((long)&self->field_0 + 0x38);
    dVar72 = auVar6._0_8_;
    dVar73 = auVar6._8_8_;
    dVar69 = dVar68 * dVar55;
    dVar71 = dVar68 * dVar56;
    uStack_340 = SUB84(dVar71,0);
    uStack_33c = (undefined4)((ulong)dVar71 >> 0x20);
    auVar25._8_4_ = SUB84(dVar76 * dVar68,0);
    auVar25._0_8_ = dVar73 * dVar72;
    auVar25._12_4_ = (int)((ulong)(dVar76 * dVar68) >> 0x20);
    auVar7 = *(undefined1 (*) [16])((long)&self->field_0 + 0x58);
    dVar70 = auVar7._0_8_;
    auVar26._8_4_ = auVar7._0_4_;
    auVar26._0_8_ = dVar75;
    auVar26._12_4_ = auVar7._4_4_;
    auVar27._8_4_ = SUB84(dVar70 * dVar1,0);
    auVar27._0_8_ = dVar75 * dVar56;
    auVar27._12_4_ = (int)((ulong)(dVar70 * dVar1) >> 0x20);
    uVar63 = auVar6._8_4_;
    uVar64 = auVar6._12_4_;
    auVar28._8_4_ = uVar63;
    auVar28._0_8_ = dVar70;
    auVar28._12_4_ = uVar64;
    auVar29._8_4_ = SUB84(dVar73 * dVar1,0);
    auVar29._0_8_ = dVar70 * dVar56;
    auVar29._12_4_ = (int)((ulong)(dVar73 * dVar1) >> 0x20);
    auVar43._8_4_ = auVar5._0_4_;
    auVar43._0_8_ = dVar72;
    auVar43._12_4_ = auVar5._4_4_;
    auVar44._8_4_ = SUB84(dVar68 * dVar73,0);
    auVar44._0_8_ = dVar72 * dVar75;
    auVar44._12_4_ = (int)((ulong)(dVar68 * dVar73) >> 0x20);
    auVar30._8_4_ = SUB84(dVar73 * dVar1,0);
    auVar30._0_8_ = dVar75 * dVar56;
    auVar30._12_4_ = (int)((ulong)(dVar73 * dVar1) >> 0x20);
    auVar31._8_4_ = SUB84(dVar75 * dVar1,0);
    auVar31._0_8_ = dVar73 * dVar56;
    auVar31._12_4_ = (int)((ulong)(dVar75 * dVar1) >> 0x20);
    dVar13 = -dVar1;
    auVar6._8_4_ = SUB84(dVar1,0);
    auVar6._0_8_ = -dVar56;
    auVar6._12_4_ = (int)((ulong)dVar13 >> 0x20);
    dVar12 = dVar13 * dVar72;
    auVar8._8_4_ = SUB84(dVar13 * dVar55,0);
    auVar8._0_8_ = dVar12;
    auVar8._12_4_ = (int)((ulong)(dVar13 * dVar55) >> 0x20);
    dVar13 = (self->field_0).m[0xf];
    uVar61 = SUB84(dVar53,0);
    uVar62 = (undefined4)((ulong)dVar53 >> 0x20);
    dVar2 = (self->field_0).m[1];
    uVar66 = auVar4._8_4_;
    uVar67 = auVar4._12_4_;
    auVar9._8_4_ = uVar61;
    auVar9._0_8_ = dVar13;
    auVar9._12_4_ = uVar62;
    dVar46 = (self->field_0).m[0xe];
    dVar50 = (self->field_0).m[0xf];
    auVar14._8_4_ = uVar61;
    auVar14._0_8_ = dVar54;
    auVar14._12_4_ = uVar62;
    uVar59 = (undefined4)((ulong)dVar2 >> 0x20);
    auVar47._8_4_ = SUB84(dVar2,0);
    auVar47._0_8_ = dVar55;
    auVar47._12_4_ = uVar59;
    uStack_330 = auVar27._8_8_;
    dVar3 = (self->field_0).m[0];
    local_98[0] = (((dVar75 * dVar72 * dVar54 + dVar55 * dVar76 * dVar50 + dVar70 * dVar56 * dVar53)
                   - dVar70 * dVar55 * dVar46) - dVar75 * dVar56 * dVar13) -
                  dVar76 * dVar72 * dVar53;
    local_98[1] = (((dVar76 * dVar68 * dVar53 + dVar2 * dVar70 * dVar46 + dVar1 * dVar75 * dVar13) -
                   dVar76 * dVar2 * dVar50) - uStack_330 * dVar53) - dVar75 * dVar68 * dVar54;
    dVar74 = auVar5._8_8_;
    dVar24 = dVar68 * dVar74;
    local_338 = dVar74 * dVar2;
    auVar5._8_4_ = SUB84(dVar2,0);
    auVar5._0_8_ = dVar73;
    auVar5._12_4_ = uVar59;
    dVar65 = dVar2 * dVar56;
    dVar52 = -dVar2;
    dVar39 = dVar52 * dVar56;
    dVar41 = dVar52 * dVar72;
    auVar32._8_4_ = SUB84(dVar41,0);
    auVar32._0_8_ = dVar39;
    auVar32._12_4_ = (int)((ulong)dVar41 >> 0x20);
    dStack_290 = auVar8._8_8_;
    dStack_300 = auVar43._8_8_;
    dStack_300 = -dStack_300;
    dVar40 = dStack_300 * dVar55;
    dVar42 = dStack_300 * dVar56;
    auVar33._8_4_ = SUB84(dVar42,0);
    auVar33._0_8_ = dVar40;
    auVar33._12_4_ = (int)((ulong)dVar42 >> 0x20);
    local_98[2] = dVar53 * dVar42 +
                  dVar13 * dStack_290 +
                  dVar54 * dVar41 + dVar13 * dVar65 + dVar53 * dVar72 * dVar1 + dVar69 * dVar54;
    local_98[3] = dVar76 * dVar40 +
                  dVar75 * dVar12 +
                  dVar70 * dVar39 +
                  dVar76 * dVar2 * dVar72 + dVar70 * dVar55 * dVar1 + dVar71 * dVar75;
    auVar48._8_4_ = SUB84(dStack_300 * dVar74,0);
    auVar48._0_8_ = -dVar72 * dVar68;
    auVar48._12_4_ = (int)((ulong)(dStack_300 * dVar74) >> 0x20);
    dStack_280 = auVar6._8_8_;
    auVar34._8_4_ = SUB84(dStack_280 * dVar74,0);
    auVar34._0_8_ = -dVar56 * dVar68;
    auVar34._12_4_ = (int)((ulong)(dStack_280 * dVar74) >> 0x20);
    auVar35._8_4_ = SUB84(dVar52 * dVar74,0);
    auVar35._0_8_ = -dVar55 * dVar68;
    auVar35._12_4_ = (int)((ulong)(dVar52 * dVar74) >> 0x20);
    dVar41 = auVar7._8_8_;
    auVar36._8_4_ = auVar7._8_4_;
    auVar36._0_8_ = dVar13;
    auVar36._12_4_ = auVar7._12_4_;
    auVar37._8_4_ = SUB84(dVar54,0);
    auVar37._0_8_ = dVar41;
    auVar37._12_4_ = (int)((ulong)dVar54 >> 0x20);
    dStack_320 = auVar29._8_8_;
    dStack_310 = auVar25._8_8_;
    dVar42 = (((dVar68 * dVar73 * dVar54 + dVar76 * dVar3 * dVar50 + dVar70 * dVar1 * dVar41) -
              dVar70 * dVar3 * dVar54) - dStack_320 * dVar13) - dStack_310 * dVar41;
    local_78._8_4_ = SUB84(dVar42,0);
    local_78._0_8_ =
         (((dVar76 * dVar72 * dVar41 + dVar70 * dVar74 * dVar46 + dVar56 * dVar73 * dVar13) -
          dVar76 * dVar74 * dVar13) - dVar70 * dVar56 * dVar41) - dVar73 * dVar72 * dVar54;
    local_78._12_4_ = (int)((ulong)dVar42 >> 0x20);
    dVar52 = dVar3 * dVar72;
    auVar15._8_4_ = SUB84(dVar3 * dVar56,0);
    auVar15._0_8_ = dVar52;
    auVar15._12_4_ = (int)((ulong)(dVar3 * dVar56) >> 0x20);
    auVar57._8_4_ = uStack_340;
    auVar57._0_8_ = dVar69;
    auVar57._12_4_ = uStack_33c;
    auVar38._8_4_ = SUB84(dVar69,0);
    auVar38._0_8_ = dVar24;
    auVar38._12_4_ = (int)((ulong)dVar69 >> 0x20);
    auVar16._8_4_ = uVar66;
    auVar16._0_8_ = auVar57._8_8_;
    auVar16._12_4_ = uVar67;
    uVar59 = auVar4._0_4_;
    uVar60 = auVar4._4_4_;
    auVar17._8_4_ = uVar59;
    auVar17._0_8_ = dVar72;
    auVar17._12_4_ = uVar60;
    auVar18._8_4_ = uVar59;
    auVar18._0_8_ = dVar13;
    auVar18._12_4_ = uVar60;
    auVar45._8_4_ = uVar59;
    auVar45._0_8_ = dVar41;
    auVar45._12_4_ = uVar60;
    dVar50 = -dVar3;
    dVar42 = dVar56 * dVar50;
    auVar4._8_4_ = SUB84(dVar72 * dVar50,0);
    auVar4._0_8_ = dVar42;
    auVar4._12_4_ = (int)((ulong)(dVar72 * dVar50) >> 0x20);
    dStack_240 = auVar26._8_8_;
    auVar10._8_4_ = SUB84(dStack_240 * dVar3,0);
    auVar10._0_8_ = dVar75 * dVar74;
    auVar10._12_4_ = (int)((ulong)(dStack_240 * dVar3) >> 0x20);
    auVar51._8_4_ = SUB84(dVar75 * dVar3,0);
    auVar51._0_8_ = dVar70 * dVar74;
    auVar51._12_4_ = (int)((ulong)(dVar75 * dVar3) >> 0x20);
    auVar19._8_4_ = auVar7._8_4_;
    auVar19._0_8_ = dVar53;
    auVar19._12_4_ = auVar7._12_4_;
    auVar20._8_4_ = uVar61;
    auVar20._0_8_ = dVar41;
    auVar20._12_4_ = uVar62;
    auVar21._8_4_ = uVar63;
    auVar21._0_8_ = dVar53;
    auVar21._12_4_ = uVar64;
    uStack_2b0._0_4_ = SUB84(dVar65,0);
    uStack_2b0._4_4_ = (undefined4)((ulong)dVar65 >> 0x20);
    auVar22._8_4_ = (undefined4)uStack_2b0;
    auVar22._0_8_ = dVar54;
    auVar22._12_4_ = uStack_2b0._4_4_;
    auVar23._8_4_ = uVar66;
    auVar23._0_8_ = dVar53;
    auVar23._12_4_ = uVar67;
    auVar7._8_4_ = uVar59;
    auVar7._0_8_ = dVar54;
    auVar7._12_4_ = uVar60;
    auVar49._8_4_ = uVar66;
    auVar49._0_8_ = dVar41;
    auVar49._12_4_ = uVar67;
    uStack_330._0_4_ = uVar63;
    uStack_330._4_4_ = uVar64;
    dStack_320 = auVar15._8_8_;
    dStack_1f0 = auVar16._8_8_;
    dStack_350 = auVar4._8_8_;
    dStack_280 = auVar34._8_8_;
    dStack_300 = auVar48._8_8_;
    dStack_130 = auVar33._8_8_;
    dVar46 = dVar73 * dStack_130 +
             dStack_280 * dVar70 +
             dVar76 * dStack_350 +
             dVar24 * dStack_1f0 + dVar70 * dStack_320 + dVar73 * dVar72 * dVar1;
    local_68._8_4_ = SUB84(dVar46,0);
    local_68._0_8_ =
         dVar54 * dStack_300 +
         dVar12 * dVar41 +
         dVar13 * dVar42 + dVar41 * auVar57._8_8_ + dVar54 * dVar52 + dVar1 * dVar74 * dVar13;
    local_68._12_4_ = (int)((ulong)dVar46 >> 0x20);
    dStack_a0 = auVar28._8_8_;
    dStack_220 = auVar47._8_8_;
    dStack_240 = auVar10._8_8_;
    dStack_100 = auVar9._8_8_;
    dStack_1b0 = auVar17._8_8_;
    dStack_310 = auVar19._8_8_;
    dStack_1d0 = auVar51._8_8_;
    dStack_140 = auVar36._8_8_;
    dStack_b0 = auVar44._8_8_;
    dStack_1e0 = auVar20._8_8_;
    local_58 = (((dVar73 * dVar72 * dVar53 + dVar75 * dVar74 * dVar13 + dVar70 * dVar55 * dVar41) -
                dVar53 * dVar70 * dVar74) - dVar73 * dVar55 * dVar13) - dVar72 * dVar75 * dVar41;
    dStack_50 = (((dVar68 * dStack_1b0 * dStack_310 +
                  dStack_240 * dStack_100 + dStack_a0 * dStack_220 * dVar13) - dVar13 * dStack_1d0)
                - dVar70 * dStack_220 * dStack_140) - dStack_b0 * dStack_1e0;
    dStack_180 = auVar18._8_8_;
    dStack_2a0 = auVar38._8_8_;
    dStack_1c0 = auVar21._8_8_;
    dStack_120 = auVar35._8_8_;
    dStack_110 = auVar32._8_8_;
    dStack_150 = auVar45._8_8_;
    dVar12 = dStack_300 * dStack_150 +
             dVar73 * dStack_110 +
             dVar70 * dVar50 * dVar55 +
             dStack_2a0 * dStack_1c0 + dStack_180 * dVar52 + local_338 * dVar70;
    local_48._8_4_ = SUB84(dVar12,0);
    local_48._0_8_ =
         dVar40 * dVar41 +
         dVar13 * dStack_120 +
         dVar53 * dStack_350 + dVar24 * dVar53 + dVar13 * dVar3 * dVar55 + dVar2 * dVar72 * dVar41;
    local_48._12_4_ = (int)((ulong)dVar12 >> 0x20);
    dStack_f0 = auVar5._8_8_;
    dStack_c0 = auVar30._8_8_;
    dStack_e0 = auVar14._8_8_;
    dStack_2e0 = auVar37._8_8_;
    dStack_d0 = auVar31._8_8_;
    dVar13 = (((dStack_c0 * dStack_1e0 + dVar75 * dVar3 * dVar54 + dStack_f0 * dVar76 * dVar41) -
              dVar3 * dVar76 * dStack_e0) - dVar73 * dStack_220 * dStack_2e0) -
             dStack_d0 * dStack_310;
    local_38._8_4_ = SUB84(dVar13,0);
    local_38._0_8_ =
         (((dVar75 * dVar56 * dVar41 + dVar76 * dVar74 * dVar53 + dVar73 * dVar55 * dVar54) -
          dVar74 * dVar75 * dVar54) - dVar76 * dVar55 * dVar41) - dVar73 * dVar56 * dVar53;
    local_38._12_4_ = (int)((ulong)dVar13 >> 0x20);
    uStack_2b0 = auVar22._8_8_;
    dStack_1a0 = auVar23._8_8_;
    dStack_270 = auVar7._8_8_;
    dStack_2d0 = auVar49._8_8_;
    dVar13 = dStack_290 * dStack_1c0 +
             dStack_2d0 * dStack_120 +
             dStack_270 * dVar42 +
             dVar1 * dVar74 * dStack_150 + dStack_1a0 * dVar3 * dVar55 + uStack_330 * uStack_2b0;
    local_28._8_4_ = SUB84(dVar13,0);
    local_28._0_8_ =
         dStack_280 * dVar53 +
         dVar41 * dVar39 +
         dVar54 * dVar50 * dVar55 +
         dVar55 * dVar1 * dVar41 + dVar53 * dStack_320 + local_338 * dVar54;
    local_28._12_4_ = (int)((ulong)dVar13 >> 0x20);
    for (lVar58 = 0; lVar58 != 0x10; lVar58 = lVar58 + 1) {
      (mR->field_0).m[lVar58] = local_98[lVar58] * (1.0 / dVar11);
    }
  }
  return mR;
}

Assistant:

HYPAPI struct matrix4 *matrix4_inverse(const struct matrix4 *self, struct matrix4 *mR)
{
	struct matrix4 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix4_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix4_identity(&inverse);

	B(11) = A3(22, 33, 44) + A3(23, 34, 42) + A3(24, 32, 43) - A3(22, 34, 43) - A3(23, 32, 44) - A3(24, 33, 42);
	B(12) = A3(12, 34, 43) + A3(13, 32, 44) + A3(14, 33, 42) - A3(12, 33, 44) - A3(13, 34, 42) - A3(14, 32, 43);
	B(13) = A3(12, 23, 44) + A3(13, 24, 42) + A3(14, 22, 43) - A3(12, 24, 43) - A3(13, 22, 44) - A3(14, 23, 42);
	B(14) = A3(12, 24, 33) + A3(13, 22, 34) + A3(14, 23, 32) - A3(12, 23, 34) - A3(13, 24, 32) - A3(14, 22, 33);
	B(21) = A3(21, 34, 43) + A3(23, 31, 44) + A3(24, 33, 41) - A3(21, 33, 44) - A3(23, 34, 41) - A3(24, 31, 43);
	B(22) = A3(11, 33, 44) + A3(13, 34, 41) + A3(14, 31, 43) - A3(11, 34, 43) - A3(13, 31, 44) - A3(14, 33, 41);
	B(23) = A3(11, 24, 43) + A3(13, 21, 44) + A3(14, 23, 41) - A3(11, 23, 44) - A3(13, 24, 41) - A3(14, 21, 43);
	B(24) = A3(11, 23, 34) + A3(13, 24, 31) + A3(14, 21, 33) - A3(11, 24, 33) - A3(13, 21, 34) - A3(14, 23, 31);
	B(31) = A3(21, 32, 44) + A3(22, 34, 41) + A3(24, 31, 42) - A3(21, 34, 42) - A3(22, 31, 44) - A3(24, 32, 41);
	B(32) = A3(11, 34, 42) + A3(12, 31, 44) + A3(14, 32, 41) - A3(11, 32, 44) - A3(12, 34, 41) - A3(14, 31, 42);
	B(33) = A3(11, 22, 44) + A3(12, 24, 41) + A3(14, 21, 42) - A3(11, 24, 42) - A3(12, 21, 44) - A3(14, 22, 41);
	B(34) = A3(11, 24, 32) + A3(12, 21, 34) + A3(14, 22, 31) - A3(11, 22, 34) - A3(12, 24, 31) - A3(14, 21, 32);
	B(41) = A3(21, 33, 42) + A3(22, 31, 43) + A3(23, 32, 41) - A3(21, 32, 43) - A3(22, 33, 41) - A3(23, 31, 42);
	B(42) = A3(11, 32, 43) + A3(12, 33, 41) + A3(13, 31, 42) - A3(11, 33, 42) - A3(12, 31, 43) - A3(13, 32, 41);
	B(43) = A3(11, 23, 42) + A3(12, 21, 43) + A3(13, 22, 41) - A3(11, 22, 43) - A3(12, 23, 41) - A3(13, 21, 42);
	B(44) = A3(11, 22, 33) + A3(12, 23, 31) + A3(13, 21, 32) - A3(11, 23, 32) - A3(12, 21, 33) - A3(13, 22, 31);

	/* divide the determinant */
	for (i = 0; i < 16; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}